

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  
  sVar7 = 0;
  sVar8 = sVar7;
  if (buflen != 0) {
    do {
      sVar8 = sVar7;
      if (buf[sVar7] != '\0') break;
      sVar7 = sVar7 + 1;
      sVar8 = buflen;
    } while (buflen != sVar7);
  }
  iVar3 = mbedtls_mpi_grow(X,((buflen - sVar8 >> 3) + 1) - (ulong)((buflen - sVar8 & 7) == 0));
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_grow(X,1), iVar3 == 0)) {
    iVar3 = 0;
    memset(X->p,0,X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (sVar8 < buflen) {
      pmVar2 = X->p;
      pbVar4 = buf + buflen;
      iVar3 = 0;
      bVar5 = 0;
      uVar6 = 0;
      do {
        pbVar4 = pbVar4 + -1;
        puVar1 = (ulong *)((long)pmVar2 + (uVar6 & 0xfffffffffffffff8));
        *puVar1 = *puVar1 | (ulong)*pbVar4 << (bVar5 & 0x38);
        uVar6 = uVar6 + 1;
        bVar5 = bVar5 + 8;
      } while (buflen - sVar8 != uVar6);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t i, j, n;

    for( n = 0; n < buflen; n++ )
        if( buf[n] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, CHARS_TO_LIMBS( buflen - n ) ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = buflen, j = 0; i > n; i--, j++ )
        X->p[j / ciL] |= ((mbedtls_mpi_uint) buf[i - 1]) << ((j % ciL) << 3);

cleanup:

    return( ret );
}